

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::DeferredTestReporter::ReportFailure
          (DeferredTestReporter *this,TestDetails *details,char *failure)

{
  FailureVec *this_00;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  reference local_28;
  DeferredTestResult *r;
  char *failure_local;
  TestDetails *details_local;
  DeferredTestReporter *this_local;
  
  r = (DeferredTestResult *)failure;
  failure_local = (char *)details;
  details_local = (TestDetails *)this;
  local_28 = std::
             vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::
             back(&this->m_results);
  local_28->failed = true;
  this_00 = &local_28->failures;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_*&,_true>(&local_50,(int *)(failure_local + 0x18),(char **)&r);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(this_00,&local_50);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair(&local_50);
  std::__cxx11::string::operator=((string *)&local_28->failureFile,*(char **)(failure_local + 0x10))
  ;
  return;
}

Assistant:

void DeferredTestReporter::ReportFailure(TestDetails const& details, char const* failure)
{
    DeferredTestResult& r = m_results.back();
    r.failed = true;
    r.failures.push_back(DeferredTestResult::Failure(details.lineNumber, failure));
    r.failureFile = details.filename;
}